

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int fficls(fitsfile *fptr,int fstcol,int ncols,char **ttype,char **tform,int *status)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  long in_R8;
  int *in_R9;
  tcolumn *colptr;
  char card [81];
  char *cptr;
  char comm [73];
  char keyname [75];
  char tfm [71];
  long repeat;
  long width;
  long nblock;
  LONGLONG delbyte;
  LONGLONG firstcol;
  LONGLONG tbcol;
  LONGLONG freespace;
  LONGLONG naxis2;
  LONGLONG naxis1;
  LONGLONG nadd;
  LONGLONG nbytes;
  LONGLONG firstbyte;
  LONGLONG datasize;
  int ii;
  int tstatus;
  int tfields;
  int decims;
  int datacode;
  int colnum;
  int *in_stack_00001520;
  int in_stack_0000152c;
  long in_stack_00001530;
  fitsfile *in_stack_00001538;
  int *in_stack_00002540;
  LONGLONG in_stack_00002548;
  LONGLONG in_stack_00002550;
  LONGLONG in_stack_00002558;
  LONGLONG in_stack_00002560;
  fitsfile *in_stack_00002568;
  int *in_stack_000184b8;
  LONGLONG in_stack_000184c0;
  LONGLONG in_stack_000184c8;
  LONGLONG in_stack_000184d0;
  fitsfile *in_stack_000184d8;
  char *in_stack_fffffffffffffe00;
  char local_1f8 [8];
  undefined1 local_1f0;
  int *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  int *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  LONGLONG *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  fitsfile *in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe60;
  int *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  fitsfile *in_stack_fffffffffffffe78;
  int *in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  fitsfile *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  fitsfile *in_stack_fffffffffffffec8;
  int *in_stack_fffffffffffffed8;
  long *in_stack_fffffffffffffee0;
  long *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff00;
  fitsfile *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  fitsfile *in_stack_ffffffffffffff20;
  long local_b0;
  long local_a8;
  long local_98;
  long local_90;
  long local_88;
  int local_48;
  int local_38;
  int local_34;
  int local_4;
  
  if (*in_R9 < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00), 0 < iVar1)) {
        return *in_R9;
      }
    }
    else {
      ffmahd(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe60);
    }
    if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
      ffpmsg((char *)0x11f313);
      *in_R9 = 0xeb;
      local_4 = 0xeb;
    }
    else {
      iVar1 = *(int *)(*(long *)(in_RDI + 2) + 0x3b0);
      if (in_ESI < 1) {
        *in_R9 = 0x12e;
        local_4 = 0x12e;
      }
      else {
        local_34 = in_ESI;
        if (iVar1 < in_ESI) {
          local_34 = iVar1 + 1;
        }
        local_98 = 0;
        for (local_48 = 0; local_48 < in_EDX; local_48 = local_48 + 1) {
          sVar3 = strlen(*(char **)(in_R8 + (long)local_48 * 8));
          if (0x46 < sVar3) {
            ffpmsg((char *)0x11f3fb);
            *in_R9 = 0x105;
            return 0x105;
          }
          strcpy(&stack0xffffffffffffff08,*(char **)(in_R8 + (long)local_48 * 8));
          ffupch(in_stack_fffffffffffffe00);
          if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) {
            ffasfm(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                   (int *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
            local_98 = local_a8 + 1 + local_98;
          }
          else {
            ffbnfm(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                   in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
            if (local_38 < 0) {
              pcVar4 = strchr(&stack0xffffffffffffff08,0x51);
              if (pcVar4 == (char *)0x0) {
                local_98 = local_98 + 8;
              }
              else {
                local_98 = local_98 + 0x10;
              }
            }
            else if (local_38 == 1) {
              local_98 = (local_b0 + 7) / 8 + local_98;
            }
            else if (local_38 == 0x10) {
              local_98 = local_b0 + local_98;
            }
            else {
              local_98 = (local_38 / 10) * local_b0 + local_98;
            }
          }
        }
        if (*in_R9 < 1) {
          local_90 = *(long *)(*(long *)(in_RDI + 2) + 0x3c8);
          lVar5 = *(long *)(*(long *)(in_RDI + 2) + 0x3d8) +
                  *(long *)(*(long *)(in_RDI + 2) + 0x3e0);
          lVar6 = local_98 * *(long *)(*(long *)(in_RDI + 2) + 0x3c0);
          if (((((lVar5 + 0xb3f) / 0xb40) * 0xb40 - lVar5) - lVar6 < 0) &&
             (iVar2 = ffiblk(in_stack_00001538,in_stack_00001530,in_stack_0000152c,in_stack_00001520
                            ), 0 < iVar2)) {
            local_4 = *in_R9;
          }
          else if ((*(long *)(*(long *)(in_RDI + 2) + 0x3e0) < 1) ||
                  (iVar2 = ffshft(in_stack_000184d8,in_stack_000184d0,in_stack_000184c8,
                                  in_stack_000184c0,in_stack_000184b8), iVar2 < 1)) {
            *(long *)(*(long *)(in_RDI + 2) + 0x3d8) =
                 lVar6 + *(long *)(*(long *)(in_RDI + 2) + 0x3d8);
            ffmkyj(in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                   (LONGLONG)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                   (int *)in_stack_fffffffffffffee8);
            if (local_34 <= iVar1) {
              in_stack_fffffffffffffe00 =
                   (char *)(*(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(local_34 + -1) * 0xa0)
              ;
              local_90 = *(long *)(in_stack_fffffffffffffe00 + 0x48);
            }
            ffcins(in_stack_00002568,in_stack_00002560,in_stack_00002558,in_stack_00002550,
                   in_stack_00002548,in_stack_00002540);
            if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) {
              for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
                ffkeyn((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                       in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
                ffgkyjj(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                        in_stack_fffffffffffffe38);
                if (local_90 < local_88) {
                  local_88 = local_98 + local_88;
                  ffmkyj(in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                         (LONGLONG)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                         (int *)in_stack_fffffffffffffee8);
                }
              }
            }
            ffmkyj(in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                   (LONGLONG)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                   (int *)in_stack_fffffffffffffee8);
            ffmkyj(in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                   (LONGLONG)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                   (int *)in_stack_fffffffffffffee8);
            if (local_34 <= iVar1) {
              ffkshf(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff14,&in_stack_ffffffffffffff08->HDUposition);
            }
            for (local_48 = 0; local_48 < in_EDX; local_48 = local_48 + 1) {
              strcpy(&stack0xfffffffffffffe68,"label for field");
              ffkeyn((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
              ffpkys(in_stack_fffffffffffffeb8,
                     (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe98);
              strcpy(&stack0xfffffffffffffe68,"format of field");
              strcpy(&stack0xffffffffffffff08,*(char **)(in_R8 + (long)local_48 * 8));
              ffupch(in_stack_fffffffffffffe00);
              ffkeyn((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
              iVar1 = local_38;
              if (local_38 < 1) {
                iVar1 = -local_38;
              }
              if (iVar1 == 0xc) {
                for (pcVar4 = &stack0xffffffffffffff08; *pcVar4 != 'S'; pcVar4 = pcVar4 + 1) {
                }
                *pcVar4 = 'B';
                ffpkys(in_stack_fffffffffffffeb8,
                       (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                       in_stack_fffffffffffffe98);
                ffkeyn((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                       in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
                strcpy(&stack0xfffffffffffffe68,"offset for signed bytes");
                ffpkyg(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                       (double)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                       in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
                ffkeyn((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                       in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
                strcpy(&stack0xfffffffffffffe68,"data are not scaled");
                ffpkyg(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                       (double)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                       in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
              }
              else {
                iVar1 = local_38;
                if (local_38 < 1) {
                  iVar1 = -local_38;
                }
                if (iVar1 == 0x14) {
                  for (pcVar4 = &stack0xffffffffffffff08; *pcVar4 != 'U'; pcVar4 = pcVar4 + 1) {
                  }
                  *pcVar4 = 'I';
                  ffpkys(in_stack_fffffffffffffeb8,
                         (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                         in_stack_fffffffffffffe98);
                  ffkeyn((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                         in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
                  strcpy(&stack0xfffffffffffffe68,"offset for unsigned integers");
                  ffpkyg(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                         (double)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                         in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
                  ffkeyn((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                         in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
                  strcpy(&stack0xfffffffffffffe68,"data are not scaled");
                  ffpkyg(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                         (double)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                         in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
                }
                else {
                  iVar1 = local_38;
                  if (local_38 < 1) {
                    iVar1 = -local_38;
                  }
                  if (iVar1 == 0x28) {
                    for (pcVar4 = &stack0xffffffffffffff08; *pcVar4 != 'V'; pcVar4 = pcVar4 + 1) {
                    }
                    *pcVar4 = 'J';
                    ffpkys(in_stack_fffffffffffffeb8,
                           (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                           in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                           in_stack_fffffffffffffe98);
                    ffkeyn((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                           in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
                    strcpy(&stack0xfffffffffffffe68,"offset for unsigned integers");
                    ffpkyg(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                           (double)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                           in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
                    ffkeyn((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                           in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
                    strcpy(&stack0xfffffffffffffe68,"data are not scaled");
                    ffpkyg(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                           (double)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                           in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
                  }
                  else {
                    iVar1 = local_38;
                    if (local_38 < 1) {
                      iVar1 = -local_38;
                    }
                    if (iVar1 == 0x50) {
                      for (pcVar4 = &stack0xffffffffffffff08; *pcVar4 != 'W'; pcVar4 = pcVar4 + 1) {
                      }
                      *pcVar4 = 'K';
                      ffpkys(in_stack_fffffffffffffeb8,
                             (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                             in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                             in_stack_fffffffffffffe98);
                      ffkeyn((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                             in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
                      strcat(local_1f8,"     ");
                      local_1f0 = 0;
                      strcat(local_1f8,"=  9223372036854775808 / offset for unsigned integers");
                      ffprec(in_stack_fffffffffffffe78,
                             (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                             in_stack_fffffffffffffe68);
                      ffkeyn((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                             in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
                      strcpy(&stack0xfffffffffffffe68,"data are not scaled");
                      ffpkyg(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             (double)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                             in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
                    }
                    else {
                      ffpkys(in_stack_fffffffffffffeb8,
                             (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                             in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                             in_stack_fffffffffffffe98);
                    }
                  }
                }
              }
              if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) {
                strcpy(&stack0xfffffffffffffe68,"beginning column of field");
                ffkeyn((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                       in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
                ffpkyj(in_stack_fffffffffffffeb8,
                       (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (LONGLONG)in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                       in_stack_fffffffffffffe98);
                ffasfm(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8
                       ,(int *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
              }
            }
            ffrdef(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
            local_4 = *in_R9;
          }
          else {
            local_4 = *in_R9;
          }
        }
        else {
          local_4 = *in_R9;
        }
      }
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int fficls(fitsfile *fptr,  /* I - FITS file pointer                        */
           int fstcol,      /* I - position for first new col. (1 = 1st)    */
           int ncols,       /* I - number of columns to insert              */
           char **ttype,    /* I - array of column names(TTYPE keywords)    */
           char **tform,    /* I - array of formats of column (TFORM)       */
           int *status)     /* IO - error status                            */
/*
 Insert 1 or more new columns into an existing table at position numcol.  If
 fstcol is greater than the number of existing columns in the table
 then the new column will be appended as the last column in the table.
*/
{
    int colnum, datacode, decims, tfields, tstatus, ii;
    LONGLONG datasize, firstbyte, nbytes, nadd, naxis1, naxis2, freespace;
    LONGLONG tbcol, firstcol, delbyte;
    long nblock, width, repeat;
    char tfm[FLEN_VALUE], keyname[FLEN_KEYWORD], comm[FLEN_COMMENT], *cptr;
    char card[FLEN_CARD];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
        /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg("Can only add columns to TABLE or BINTABLE extension (fficls)");
       return(*status = NOT_TABLE);
    }

    /*  is the column number valid?  */
    tfields = (fptr->Fptr)->tfield;
    if (fstcol < 1 )
        return(*status = BAD_COL_NUM);
    else if (fstcol > tfields)
        colnum = tfields + 1;   /* append as last column */
    else
        colnum = fstcol;

    /* parse the tform value and calc number of bytes to add to each row */
    delbyte = 0;
    for (ii = 0; ii < ncols; ii++)
    {
        if (strlen(tform[ii]) > FLEN_VALUE-1)
        {
           ffpmsg("Column format string too long (fficls)");
           return (*status=BAD_TFORM);
        }
        strcpy(tfm, tform[ii]);
        ffupch(tfm);         /* make sure format is in upper case */

        if ((fptr->Fptr)->hdutype == ASCII_TBL)
        {
            ffasfm(tfm, &datacode, &width, &decims, status);
            delbyte += width + 1;  /*  add one space between the columns */
        }
        else
        {
            ffbnfm(tfm, &datacode, &repeat, &width, status);

            if (datacode < 0)  {       /* variable length array column */
	        if (strchr(tfm, 'Q'))
		  delbyte += 16;
		else
                  delbyte += 8;
            } else if (datacode == 1)          /* bit column; round up  */
                delbyte += (repeat + 7) / 8; /* to multiple of 8 bits */
            else if (datacode == 16)  /* ASCII string column */
                delbyte += repeat;
            else                      /* numerical data type */
                delbyte += (datacode / 10) * repeat;
        }
    }

    if (*status > 0) 
        return(*status);

    /* get the current size of the table */
    /* use internal structure since NAXIS2 keyword may not be up to date */
    naxis1 = (fptr->Fptr)->rowlength;
    naxis2 = (fptr->Fptr)->numrows;

    /* current size of data */
    datasize = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
    freespace = ( ( (datasize + 2879) / 2880) * 2880) - datasize;
    nadd = delbyte * naxis2;   /* no. of bytes to add to table */

    if ( (freespace - nadd) < 0)   /* not enough existing space? */
    {
        nblock = (long) ((nadd - freespace + 2879) / 2880);     /* number of blocks  */
        if (ffiblk(fptr, nblock, 1, status) > 0)       /* insert the blocks */
            return(*status);
    }

    /* shift heap down (if it exists) */
    if ((fptr->Fptr)->heapsize > 0)
    {
        nbytes = (fptr->Fptr)->heapsize;    /* no. of bytes to shift down */

        /* absolute heap pos */
        firstbyte = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;

        if (ffshft(fptr, firstbyte, nbytes, nadd, status) > 0) /* move heap */
            return(*status);
    }

    /* update the heap starting address */
    (fptr->Fptr)->heapstart += nadd;

    /* update the THEAP keyword if it exists */
    tstatus = 0;
    ffmkyj(fptr, "THEAP", (fptr->Fptr)->heapstart, "&", &tstatus);

    /* calculate byte position in the row where to insert the new column */
    if (colnum > tfields)
        firstcol = naxis1;
    else
    {
        colptr = (fptr->Fptr)->tableptr;
        colptr += (colnum - 1);
        firstcol = colptr->tbcol;
    }

    /* insert delbyte bytes in every row, at byte position firstcol */
    ffcins(fptr, naxis1, naxis2, delbyte, firstcol, status);

    if ((fptr->Fptr)->hdutype == ASCII_TBL)
    {
        /* adjust the TBCOL values of the existing columns */
        for(ii = 0; ii < tfields; ii++)
        {
            ffkeyn("TBCOL", ii + 1, keyname, status);
            ffgkyjj(fptr, keyname, &tbcol, comm, status);
            if (tbcol > firstcol)
            {
                tbcol += delbyte;
                ffmkyj(fptr, keyname, tbcol, "&", status);
            }
        }
    }

    /* update the mandatory keywords */
    ffmkyj(fptr, "TFIELDS", tfields + ncols, "&", status);
    ffmkyj(fptr, "NAXIS1", naxis1 + delbyte, "&", status);

    /* increment the index value on any existing column keywords */
    if(colnum <= tfields)
        ffkshf(fptr, colnum, tfields, ncols, status);

    /* add the required keywords for the new columns */
    for (ii = 0; ii < ncols; ii++, colnum++)
    {
        strcpy(comm, "label for field");
        ffkeyn("TTYPE", colnum, keyname, status);
        ffpkys(fptr, keyname, ttype[ii], comm, status);

        strcpy(comm, "format of field");
        strcpy(tfm, tform[ii]);
        ffupch(tfm);         /* make sure format is in upper case */
        ffkeyn("TFORM", colnum, keyname, status);

        if (abs(datacode) == TSBYTE) 
        {
           /* Replace the 'S' with an 'B' in the TFORMn code */
           cptr = tfm;
           while (*cptr != 'S') 
              cptr++;

           *cptr = 'B';
           ffpkys(fptr, keyname, tfm, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", colnum, keyname, status);
           strcpy(comm, "offset for signed bytes");

           ffpkyg(fptr, keyname, -128., 0, comm, status);

           ffkeyn("TSCAL", colnum, keyname, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, keyname, 1., 0, comm, status);
        }
        else if (abs(datacode) == TUSHORT) 
        {
           /* Replace the 'U' with an 'I' in the TFORMn code */
           cptr = tfm;
           while (*cptr != 'U') 
              cptr++;

           *cptr = 'I';
           ffpkys(fptr, keyname, tfm, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", colnum, keyname, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, keyname, 32768., 0, comm, status);

           ffkeyn("TSCAL", colnum, keyname, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, keyname, 1., 0, comm, status);
        }
        else if (abs(datacode) == TULONG) 
        {
           /* Replace the 'V' with an 'J' in the TFORMn code */
           cptr = tfm;
           while (*cptr != 'V') 
              cptr++;

           *cptr = 'J';
           ffpkys(fptr, keyname, tfm, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", colnum, keyname, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, keyname, 2147483648., 0, comm, status);

           ffkeyn("TSCAL", colnum, keyname, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, keyname, 1., 0, comm, status);
        }
        else if (abs(datacode) == TULONGLONG) 
        {	   
           /* Replace the 'W' with an 'K' in the TFORMn code */
           cptr = tfm;
           while (*cptr != 'W') 
              cptr++;

           *cptr = 'K';
           ffpkys(fptr, keyname, tfm, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", colnum, card, status);
           strcat(card, "     ");  /* make sure name is >= 8 chars long */
           *(card+8) = '\0';
	   strcat(card, "=  9223372036854775808 / offset for unsigned integers");
	   fits_write_record(fptr, card, status);

           ffkeyn("TSCAL", colnum, keyname, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, keyname, 1., 0, comm, status);
        }
        else
        {
           ffpkys(fptr, keyname, tfm, comm, status);
        }

        if ((fptr->Fptr)->hdutype == ASCII_TBL)   /* write the TBCOL keyword */
        {
            if (colnum == tfields + 1)
                tbcol = firstcol + 2;  /* allow space between preceding col */
            else
                tbcol = firstcol + 1;

            strcpy(comm, "beginning column of field");
            ffkeyn("TBCOL", colnum, keyname, status);
            ffpkyj(fptr, keyname, tbcol, comm, status);

            /* increment the column starting position for the next column */
            ffasfm(tfm, &datacode, &width, &decims, status);
            firstcol += width + 1;  /*  add one space between the columns */
        }
    }
    ffrdef(fptr, status); /* initialize the new table structure */
    return(*status);
}